

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# l2_eval.c
# Opt level: O0

l2_expr_info *
l2_eval_expr_comma1(l2_expr_info *__return_storage_ptr__,l2_scope *scope_p,
                   l2_expr_info left_expr_info)

{
  l2_expr_info lVar1;
  boolean bVar2;
  l2_expr_info local_40;
  undefined1 local_28 [8];
  l2_expr_info right_expr_p;
  l2_scope *scope_p_local;
  
  lVar1 = left_expr_info;
  right_expr_p.val.procedure.upper_scope_p = scope_p;
  bVar2 = l2_parse_probe_next_token_by_type(L2_TOKEN_COMMA);
  if (bVar2 == '\0') {
    __return_storage_ptr__->val_type = left_expr_info.val_type;
    *(undefined4 *)&__return_storage_ptr__->field_0x4 = left_expr_info._4_4_;
    left_expr_info.val.integer = lVar1.val._0_8_;
    (__return_storage_ptr__->val).real = left_expr_info.val.real;
    left_expr_info.val.procedure.upper_scope_p = lVar1.val._8_8_;
    (__return_storage_ptr__->val).procedure.upper_scope_p =
         left_expr_info.val.procedure.upper_scope_p;
  }
  else {
    l2_parse_token_forward();
    l2_eval_expr_assign(&local_40,right_expr_p.val.procedure.upper_scope_p);
    local_28 = (undefined1  [8])local_40._0_8_;
    right_expr_p._0_8_ = local_40.val.real;
    right_expr_p.val.real = local_40.val._8_8_;
    lVar1.val.real = local_40.val.real;
    lVar1.val_type = local_40.val_type;
    lVar1._4_4_ = local_40._4_4_;
    lVar1.val.procedure.upper_scope_p = local_40.val.procedure.upper_scope_p;
    l2_eval_expr_comma1(__return_storage_ptr__,right_expr_p.val.procedure.upper_scope_p,lVar1);
  }
  return __return_storage_ptr__;
}

Assistant:

l2_expr_info l2_eval_expr_comma1(l2_scope *scope_p, l2_expr_info left_expr_info) {
    _if_type (L2_TOKEN_COMMA)
    {
        l2_expr_info right_expr_p;
        right_expr_p = l2_eval_expr_assign(scope_p);
        return l2_eval_expr_comma1(scope_p, right_expr_p);
    }
    _else
    {
        return left_expr_info;
    }
}